

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::alerts_dropped_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,alerts_dropped_alert *this)

{
  bool bVar1;
  int idx;
  size_t __position;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"dropped alerts: ","");
  __position = 0;
  do {
    bVar1 = std::bitset<97UL>::test(&this->dropped_alerts,__position);
    if (bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    __position = __position + 1;
  } while (__position != 0x61);
  return __return_storage_ptr__;
}

Assistant:

std::string alerts_dropped_alert::message() const
	{
		std::string ret = "dropped alerts: ";

		TORRENT_ASSERT(int(dropped_alerts.size()) == num_alert_types);
		for (int idx = 0; idx < num_alert_types; ++idx)
		{
			if (!dropped_alerts.test(std::size_t(idx))) continue;
			ret += alert_name(idx);
			ret += ' ';
		}

		return ret;
	}